

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_recho(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  DESCRIPTOR_DATA **ppDVar4;
  char buffer [9216];
  char acStack_2438 [9224];
  
  if (*argument != '\0') {
    ppDVar4 = &descriptor_list;
    while (ppDVar4 = &((DESCRIPTOR_DATA *)ppDVar4)->next->next,
          (DESCRIPTOR_DATA *)ppDVar4 != (DESCRIPTOR_DATA *)0x0) {
      if ((((DESCRIPTOR_DATA *)ppDVar4)->connected == 0) &&
         (((DESCRIPTOR_DATA *)ppDVar4)->character->in_room == ch->in_room)) {
        colorconv(acStack_2438,argument,((DESCRIPTOR_DATA *)ppDVar4)->character);
        iVar2 = get_trust(((DESCRIPTOR_DATA *)ppDVar4)->character);
        iVar3 = get_trust(ch);
        if (iVar3 <= iVar2) {
          bVar1 = is_npc(ch);
          if (!bVar1) {
            send_to_char("local> ",((DESCRIPTOR_DATA *)ppDVar4)->character);
          }
        }
        send_to_char(acStack_2438,((DESCRIPTOR_DATA *)ppDVar4)->character);
        send_to_char("\n\r",((DESCRIPTOR_DATA *)ppDVar4)->character);
      }
    }
    return;
  }
  send_to_char("Local echo what?\n\r",ch);
  return;
}

Assistant:

void do_recho(CHAR_DATA *ch, char *argument)
{
	DESCRIPTOR_DATA *d;
	char buffer[MAX_STRING_LENGTH * 2];

	if (argument[0] == '\0')
	{
		send_to_char("Local echo what?\n\r", ch);
		return;
	}

	for (d = descriptor_list; d; d = d->next)
	{
		if (d->connected == CON_PLAYING && d->character->in_room == ch->in_room)
		{
			colorconv(buffer, argument, d->character);

			if (get_trust(d->character) >= get_trust(ch) && !is_npc(ch))
				send_to_char("local> ", d->character);

			send_to_char(buffer, d->character);
			send_to_char("\n\r", d->character);
		}
	}
}